

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O2

void __thiscall VCTools::InputParser::InputParser(InputParser *this,int argc,char **argv)

{
  long lVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string((string *)&local_50,argv[lVar1],&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

InputParser(int argc, char** argv) {
			for (int i = 1; i < argc; ++i)
				this->tokens.push_back(string(argv[i]));
		}